

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O0

void nukedopll_reset_chip(void *chipptr)

{
  undefined8 uVar1;
  uint local_2c;
  UINT32 mute;
  DEV_DATA devData;
  UINT8 chn;
  opll_t *chip;
  void *chipptr_local;
  
  uVar1 = *chipptr;
  local_2c = 0;
  for (devData.chipInf._7_1_ = 0; devData.chipInf._7_1_ < 0xe;
      devData.chipInf._7_1_ = devData.chipInf._7_1_ + 1) {
    local_2c = *(int *)((long)chipptr + (ulong)devData.chipInf._7_1_ * 4 + 0x198) <<
               (devData.chipInf._7_1_ & 0x1f) | local_2c;
  }
  NOPLL_Reset((opll_t *)chipptr,*(uint32_t *)((long)chipptr + 0x10),
              *(uint32_t *)((long)chipptr + 0xc),*(uint32_t *)((long)chipptr + 8));
  *(undefined8 *)chipptr = uVar1;
  for (devData.chipInf._7_1_ = 0; devData.chipInf._7_1_ < 0xe;
      devData.chipInf._7_1_ = devData.chipInf._7_1_ + 1) {
    *(uint *)((long)chipptr + (ulong)devData.chipInf._7_1_ * 4 + 0x198) =
         local_2c >> (devData.chipInf._7_1_ & 0x1f) & 1;
  }
  return;
}

Assistant:

static void nukedopll_reset_chip(void *chipptr)
{
	opll_t *chip = (opll_t *)chipptr;
	UINT8 chn;
	DEV_DATA devData;
	UINT32 mute;
	
	devData = chip->_devData;
	mute = 0;
	for (chn = 0; chn < 14; chn ++)
		mute |= (chip->mute[chn] << chn);
	
	NOPLL_Reset(chip, chip->chip_type, chip->smplRate, chip->clock);
	
	chip->_devData = devData;
	for (chn = 0; chn < 14; chn ++)
		chip->mute[chn] = (mute >> chn) & 0x01;
	
	return;
}